

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_pstream.c
# Opt level: O1

HTS_Boolean
HTS_PStreamSet_create
          (HTS_PStreamSet *pss,HTS_SStreamSet *sss,double *msd_threshold,double *gv_weight)

{
  double dVar1;
  double dVar2;
  int iVar3;
  double *pdVar4;
  double **ppdVar5;
  double *pdVar6;
  HTS_Boolean HVar7;
  bool bVar8;
  int iVar9;
  size_t sVar10;
  HTS_PStream *pHVar11;
  size_t sVar12;
  size_t sVar13;
  HTS_Boolean *pHVar14;
  double **ppdVar15;
  double *pdVar16;
  int *piVar17;
  double *pdVar18;
  ulong uVar19;
  size_t sVar20;
  long lVar21;
  ulong uVar22;
  int iVar23;
  undefined8 *puVar24;
  ulong uVar25;
  double **ppdVar26;
  ulong uVar27;
  double **ppdVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  long lVar32;
  ulong uVar33;
  bool bVar34;
  double dVar35;
  double dVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined8 uVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double vari;
  double mean;
  long local_d8;
  ulong local_c8;
  double local_a8;
  double local_a0;
  double local_98;
  double dStack_90;
  double *local_80;
  double local_78;
  undefined8 uStack_70;
  double local_68;
  undefined8 uStack_60;
  double *local_50;
  double local_48;
  double dStack_40;
  
  if (pss->nstream == 0) {
    sVar10 = HTS_SStreamSet_get_nstream(sss);
    pss->nstream = sVar10;
    pHVar11 = (HTS_PStream *)HTS_calloc(sVar10,0x90);
    pss->pstream = pHVar11;
    sVar10 = HTS_SStreamSet_get_total_frame(sss);
    pss->total_frame = sVar10;
    if (pss->nstream != 0) {
      sVar10 = 0;
      local_80 = msd_threshold;
      local_50 = gv_weight;
      do {
        pdVar16 = local_80;
        pHVar11 = pss->pstream + sVar10;
        HVar7 = HTS_SStreamSet_is_msd(sss,sVar10);
        if (HVar7 == '\x01') {
          pHVar11->length = 0;
          sVar12 = HTS_SStreamSet_get_total_state(sss);
          if (sVar12 != 0) {
            sVar12 = 0;
            do {
              dVar35 = HTS_SStreamSet_get_msd(sss,sVar10,sVar12);
              if (pdVar16[sVar10] <= dVar35 && dVar35 != pdVar16[sVar10]) {
                sVar13 = HTS_SStreamSet_get_duration(sss,sVar12);
                pHVar11->length = pHVar11->length + sVar13;
              }
              sVar12 = sVar12 + 1;
              sVar13 = HTS_SStreamSet_get_total_state(sss);
            } while (sVar12 < sVar13);
          }
          pHVar14 = (HTS_Boolean *)HTS_calloc(pss->total_frame,1);
          pHVar11->msd_flag = pHVar14;
          sVar12 = HTS_SStreamSet_get_total_state(sss);
          if (sVar12 != 0) {
            sVar12 = 0;
            lVar21 = 0;
            do {
              dVar36 = HTS_SStreamSet_get_msd(sss,sVar10,sVar12);
              dVar35 = local_80[sVar10];
              sVar13 = HTS_SStreamSet_get_duration(sss,sVar12);
              if (dVar36 <= dVar35) {
                if (sVar13 != 0) {
                  uVar30 = 0;
                  do {
                    pHVar11->msd_flag[lVar21] = '\0';
                    lVar21 = lVar21 + 1;
                    uVar30 = uVar30 + 1;
                    sVar13 = HTS_SStreamSet_get_duration(sss,sVar12);
                  } while (uVar30 < sVar13);
                }
              }
              else if (sVar13 != 0) {
                uVar30 = 0;
                do {
                  pHVar11->msd_flag[lVar21] = '\x01';
                  lVar21 = lVar21 + 1;
                  uVar30 = uVar30 + 1;
                  sVar13 = HTS_SStreamSet_get_duration(sss,sVar12);
                } while (uVar30 < sVar13);
              }
              sVar12 = sVar12 + 1;
              sVar13 = HTS_SStreamSet_get_total_state(sss);
            } while (sVar12 < sVar13);
          }
        }
        else {
          pHVar11->length = pss->total_frame;
          pHVar11->msd_flag = (HTS_Boolean *)0x0;
        }
        sVar12 = HTS_SStreamSet_get_vector_length(sss,sVar10);
        pHVar11->vector_length = sVar12;
        sVar12 = HTS_SStreamSet_get_window_max_width(sss,sVar10);
        pHVar11->width = sVar12 * 2 + 1;
        sVar12 = HTS_SStreamSet_get_window_size(sss,sVar10);
        pHVar11->win_size = sVar12;
        if (pHVar11->length != 0) {
          ppdVar15 = HTS_alloc_matrix(pHVar11->length,sVar12 * pHVar11->vector_length);
          (pHVar11->sm).mean = ppdVar15;
          ppdVar15 = HTS_alloc_matrix(pHVar11->length,pHVar11->win_size * pHVar11->vector_length);
          (pHVar11->sm).ivar = ppdVar15;
          pdVar16 = (double *)HTS_calloc(pHVar11->length,8);
          (pHVar11->sm).wum = pdVar16;
          ppdVar15 = HTS_alloc_matrix(pHVar11->length,pHVar11->width);
          (pHVar11->sm).wuw = ppdVar15;
          pdVar16 = (double *)HTS_calloc(pHVar11->length,8);
          (pHVar11->sm).g = pdVar16;
          ppdVar15 = HTS_alloc_matrix(pHVar11->length,pHVar11->vector_length);
          pHVar11->par = ppdVar15;
        }
        piVar17 = (int *)HTS_calloc(pHVar11->win_size,4);
        pHVar11->win_l_width = piVar17;
        piVar17 = (int *)HTS_calloc(pHVar11->win_size,4);
        pHVar11->win_r_width = piVar17;
        ppdVar15 = (double **)HTS_calloc(pHVar11->win_size,8);
        pHVar11->win_coefficient = ppdVar15;
        if (pHVar11->win_size != 0) {
          sVar12 = 0;
          do {
            iVar9 = HTS_SStreamSet_get_window_left_width(sss,sVar10,sVar12);
            pHVar11->win_l_width[sVar12] = iVar9;
            iVar9 = HTS_SStreamSet_get_window_right_width(sss,sVar10,sVar12);
            pHVar11->win_r_width[sVar12] = iVar9;
            pdVar16 = (double *)
                      HTS_calloc((long)(int)((uint)(iVar9 + pHVar11->win_l_width[sVar12] == 0) +
                                            pHVar11->win_l_width[sVar12] * -2),8);
            pHVar11->win_coefficient[sVar12] = pdVar16;
            pHVar11->win_coefficient[sVar12] =
                 pHVar11->win_coefficient[sVar12] + -(long)pHVar11->win_l_width[sVar12];
            iVar9 = pHVar11->win_l_width[sVar12];
            if (iVar9 <= pHVar11->win_r_width[sVar12]) {
              lVar21 = (long)iVar9 + -1;
              do {
                dVar35 = HTS_SStreamSet_get_window_coefficient(sss,sVar10,sVar12,iVar9);
                pHVar11->win_coefficient[sVar12][lVar21 + 1] = dVar35;
                lVar21 = lVar21 + 1;
                iVar9 = iVar9 + 1;
              } while (lVar21 < pHVar11->win_r_width[sVar12]);
            }
            sVar12 = sVar12 + 1;
          } while (sVar12 < pHVar11->win_size);
        }
        HVar7 = HTS_SStreamSet_use_gv(sss,sVar10);
        if (HVar7 == '\0') {
          pHVar11->gv_switch = (HTS_Boolean *)0x0;
          pHVar11->gv_length = 0;
          pHVar11->gv_mean = (double *)0x0;
          pHVar11->gv_vari = (double *)0x0;
        }
        else {
          pdVar16 = (double *)HTS_calloc(pHVar11->vector_length,8);
          pHVar11->gv_mean = pdVar16;
          pdVar18 = (double *)HTS_calloc(pHVar11->vector_length,8);
          pdVar16 = local_50;
          pHVar11->gv_vari = pdVar18;
          if (pHVar11->vector_length != 0) {
            sVar12 = 0;
            do {
              dVar35 = HTS_SStreamSet_get_gv_mean(sss,sVar10,sVar12);
              pHVar11->gv_mean[sVar12] = dVar35 * pdVar16[sVar10];
              dVar35 = HTS_SStreamSet_get_gv_vari(sss,sVar10,sVar12);
              pHVar11->gv_vari[sVar12] = dVar35;
              sVar12 = sVar12 + 1;
            } while (sVar12 < pHVar11->vector_length);
          }
          pHVar14 = (HTS_Boolean *)HTS_calloc(pHVar11->length,1);
          pHVar11->gv_switch = pHVar14;
          HVar7 = HTS_SStreamSet_is_msd(sss,sVar10);
          sVar12 = HTS_SStreamSet_get_total_state(sss);
          if (HVar7 == '\x01') {
            if (sVar12 != 0) {
              sVar12 = 0;
              lVar32 = 0;
              lVar21 = 0;
              do {
                sVar13 = HTS_SStreamSet_get_duration(sss,sVar12);
                if (sVar13 != 0) {
                  uVar30 = 0;
                  do {
                    if (pHVar11->msd_flag[lVar21] == '\x01') {
                      HVar7 = HTS_SStreamSet_get_gv_switch(sss,sVar10,sVar12);
                      pHVar11->gv_switch[lVar32] = HVar7;
                      lVar32 = lVar32 + 1;
                    }
                    uVar30 = uVar30 + 1;
                    lVar21 = lVar21 + 1;
                    sVar13 = HTS_SStreamSet_get_duration(sss,sVar12);
                  } while (uVar30 < sVar13);
                }
                sVar12 = sVar12 + 1;
                sVar13 = HTS_SStreamSet_get_total_state(sss);
              } while (sVar12 < sVar13);
            }
          }
          else if (sVar12 != 0) {
            sVar12 = 0;
            lVar21 = 0;
            do {
              sVar13 = HTS_SStreamSet_get_duration(sss,sVar12);
              if (sVar13 != 0) {
                uVar30 = 0;
                do {
                  HVar7 = HTS_SStreamSet_get_gv_switch(sss,sVar10,sVar12);
                  pHVar11->gv_switch[lVar21] = HVar7;
                  lVar21 = lVar21 + 1;
                  uVar30 = uVar30 + 1;
                  sVar13 = HTS_SStreamSet_get_duration(sss,sVar12);
                } while (uVar30 < sVar13);
              }
              sVar12 = sVar12 + 1;
              sVar13 = HTS_SStreamSet_get_total_state(sss);
            } while (sVar12 < sVar13);
          }
          pHVar11->gv_length = 0;
          if (pHVar11->length != 0) {
            sVar12 = 0;
            do {
              if (pHVar11->gv_switch[sVar12] != '\0') {
                pHVar11->gv_length = pHVar11->gv_length + 1;
              }
              sVar12 = sVar12 + 1;
            } while (pHVar11->length != sVar12);
          }
        }
        HVar7 = HTS_SStreamSet_is_msd(sss,sVar10);
        sVar12 = HTS_SStreamSet_get_total_state(sss);
        if (HVar7 == '\x01') {
          if (sVar12 != 0) {
            uVar30 = 0;
            local_c8 = 0;
            dVar35 = 0.0;
            do {
              sVar12 = HTS_SStreamSet_get_duration(sss,uVar30);
              if (sVar12 != 0) {
                uVar19 = 0;
                do {
                  if (pHVar11->msd_flag[(long)dVar35] == '\x01') {
                    if (pHVar11->win_size != 0) {
                      local_68 = (double)(long)SUB84(dVar35,0);
                      uVar29 = 0;
                      local_78 = dVar35;
                      do {
                        iVar9 = pHVar11->win_l_width[uVar29];
                        lVar21 = (long)iVar9;
                        iVar3 = pHVar11->win_r_width[uVar29];
                        bVar8 = iVar3 < iVar9;
                        if ((iVar9 <= iVar3) && (iVar23 = iVar9 + SUB84(local_78,0), -1 < iVar23)) {
                          iVar9 = iVar3 - iVar9;
                          while ((lVar21 < (long)(int)pss->total_frame - (long)local_68 &&
                                 (pHVar11->msd_flag[lVar21 + (long)local_78] == '\x01'))) {
                            bVar8 = iVar3 <= lVar21;
                            bVar34 = iVar9 == 0;
                            iVar9 = iVar9 + -1;
                            if ((bVar34) || (lVar21 = lVar21 + 1, iVar23 < 0)) break;
                          }
                        }
                        uVar25 = pHVar11->vector_length;
                        if (uVar25 != 0) {
                          local_98 = (double)CONCAT71(local_98._1_7_,uVar29 == 0 | bVar8);
                          uVar31 = 0;
                          do {
                            sVar12 = uVar25 * uVar29 + uVar31;
                            dVar35 = HTS_SStreamSet_get_mean(sss,sVar10,uVar30,sVar12);
                            (pHVar11->sm).mean[local_c8][sVar12] = dVar35;
                            dVar35 = 0.0;
                            if (((ulong)local_98 & 1) != 0) {
                              dVar36 = HTS_SStreamSet_get_vari(sss,sVar10,uVar30,sVar12);
                              dVar35 = 0.0;
                              if (((ABS(dVar36) < 1e+19) &&
                                  ((1e-19 < dVar36 || (dVar35 = 1e+38, dVar36 < 0.0)))) &&
                                 ((dVar36 < -1e-19 || (dVar35 = -1e+38, 0.0 <= dVar36)))) {
                                dVar35 = 1.0 / dVar36;
                              }
                            }
                            (pHVar11->sm).ivar[local_c8][sVar12] = dVar35;
                            uVar31 = uVar31 + 1;
                            uVar25 = pHVar11->vector_length;
                          } while (uVar31 < uVar25);
                        }
                        uVar29 = uVar29 + 1;
                        dVar35 = local_78;
                      } while (uVar29 < pHVar11->win_size);
                    }
                    local_c8 = local_c8 + 1;
                  }
                  dVar35 = (double)((long)dVar35 + 1);
                  uVar19 = uVar19 + 1;
                  sVar12 = HTS_SStreamSet_get_duration(sss,uVar30);
                } while (uVar19 < sVar12);
              }
              uVar30 = uVar30 + 1;
              sVar12 = HTS_SStreamSet_get_total_state(sss);
            } while (uVar30 < sVar12);
          }
        }
        else if (sVar12 != 0) {
          uVar30 = 0;
          local_d8 = 0;
          do {
            sVar12 = HTS_SStreamSet_get_duration(sss,uVar30);
            if (sVar12 != 0) {
              local_c8 = 0;
              do {
                if (pHVar11->win_size != 0) {
                  uVar19 = 0;
                  do {
                    iVar9 = pHVar11->win_l_width[uVar19];
                    iVar3 = pHVar11->win_r_width[uVar19];
                    bVar8 = iVar3 < iVar9;
                    if (iVar9 <= iVar3) {
                      iVar23 = iVar9 + (int)local_d8;
                      if (-1 < iVar23) {
                        do {
                          if (((int)pss->total_frame <= (int)local_d8 + iVar9) ||
                             (bVar8 = iVar3 <= iVar9, iVar9 == iVar3)) break;
                          iVar9 = iVar9 + 1;
                        } while (-1 < iVar23);
                      }
                    }
                    uVar29 = pHVar11->vector_length;
                    if (uVar29 != 0) {
                      local_98 = (double)CONCAT71(local_98._1_7_,uVar19 == 0 | bVar8);
                      uVar25 = 0;
                      do {
                        sVar12 = uVar29 * uVar19 + uVar25;
                        dVar35 = HTS_SStreamSet_get_mean(sss,sVar10,uVar30,sVar12);
                        (pHVar11->sm).mean[local_d8][sVar12] = dVar35;
                        dVar35 = 0.0;
                        if (((ulong)local_98 & 1) != 0) {
                          dVar36 = HTS_SStreamSet_get_vari(sss,sVar10,uVar30,sVar12);
                          dVar35 = 0.0;
                          if (((ABS(dVar36) < 1e+19) &&
                              ((1e-19 < dVar36 || (dVar35 = 1e+38, dVar36 < 0.0)))) &&
                             ((dVar36 < -1e-19 || (dVar35 = -1e+38, 0.0 <= dVar36)))) {
                            dVar35 = 1.0 / dVar36;
                          }
                        }
                        (pHVar11->sm).ivar[local_d8][sVar12] = dVar35;
                        uVar25 = uVar25 + 1;
                        uVar29 = pHVar11->vector_length;
                      } while (uVar25 < uVar29);
                    }
                    uVar19 = uVar19 + 1;
                  } while (uVar19 < pHVar11->win_size);
                }
                local_d8 = local_d8 + 1;
                local_c8 = local_c8 + 1;
                sVar12 = HTS_SStreamSet_get_duration(sss,uVar30);
              } while (local_c8 < sVar12);
            }
            uVar30 = uVar30 + 1;
            sVar12 = HTS_SStreamSet_get_total_state(sss);
          } while (uVar30 < sVar12);
        }
        if ((pHVar11->length != 0) && (pHVar11->vector_length != 0)) {
          sVar12 = 0;
          do {
            HTS_PStream_calc_wuw_and_wum(pHVar11,sVar12);
            uVar30 = pHVar11->length;
            if (uVar30 != 0) {
              uVar19 = pHVar11->width;
              lVar21 = -8;
              uVar29 = 0;
              do {
                if (uVar29 != 0 && 1 < uVar19) {
                  ppdVar15 = (pHVar11->sm).wuw;
                  pdVar16 = ppdVar15[uVar29];
                  dVar35 = *pdVar16;
                  puVar24 = (undefined8 *)((long)ppdVar15 + lVar21);
                  uVar25 = 1;
                  do {
                    dVar36 = ((double *)*puVar24)[uVar25];
                    dVar35 = dVar35 - dVar36 * dVar36 * *(double *)*puVar24;
                    *pdVar16 = dVar35;
                    if (uVar29 <= uVar25) break;
                    uVar25 = uVar25 + 1;
                    puVar24 = puVar24 + -1;
                  } while (uVar25 < uVar19);
                }
                if (1 < uVar19) {
                  ppdVar15 = (pHVar11->sm).wuw;
                  pdVar16 = ppdVar15[uVar29];
                  uVar31 = 2;
                  uVar25 = 1;
                  do {
                    uVar27 = uVar25 + 1;
                    if ((uVar29 != 0) && (uVar27 < uVar19)) {
                      dVar35 = pdVar16[uVar25];
                      uVar22 = 1;
                      puVar24 = (undefined8 *)((long)ppdVar15 + lVar21);
                      uVar33 = uVar31;
                      do {
                        pdVar18 = (double *)*puVar24;
                        dVar35 = dVar35 - pdVar18[uVar33] * pdVar18[uVar22] * *pdVar18;
                        pdVar16[uVar25] = dVar35;
                        if (uVar29 <= uVar22) break;
                        uVar22 = uVar22 + 1;
                        uVar33 = uVar33 + 1;
                        puVar24 = puVar24 + -1;
                      } while (uVar33 < uVar19);
                    }
                    pdVar16[uVar25] = pdVar16[uVar25] / *pdVar16;
                    uVar31 = uVar31 + 1;
                    uVar25 = uVar27;
                  } while (uVar27 != uVar19);
                }
                uVar29 = uVar29 + 1;
                lVar21 = lVar21 + 8;
              } while (uVar29 != uVar30);
              pdVar18 = (pHVar11->sm).g;
              pdVar4 = (pHVar11->sm).wum;
              pdVar16 = pdVar18 + -1;
              lVar21 = -8;
              uVar29 = 0;
              do {
                dVar35 = pdVar4[uVar29];
                pdVar18[uVar29] = dVar35;
                if (uVar29 != 0 && 1 < uVar19) {
                  ppdVar15 = (pHVar11->sm).wuw;
                  uVar25 = 1;
                  lVar32 = 0;
                  do {
                    dVar35 = dVar35 - *(double *)
                                       (*(long *)((long)ppdVar15 + lVar32 + lVar21) + uVar25 * 8) *
                                      *(double *)((long)pdVar16 + lVar32);
                    pdVar18[uVar29] = dVar35;
                    if (uVar29 <= uVar25) break;
                    uVar25 = uVar25 + 1;
                    lVar32 = lVar32 + -8;
                  } while (uVar25 < uVar19);
                }
                uVar29 = uVar29 + 1;
                pdVar16 = pdVar16 + 1;
                lVar21 = lVar21 + 8;
              } while (uVar29 != uVar30);
              ppdVar5 = pHVar11->par;
              ppdVar26 = (pHVar11->sm).wuw;
              ppdVar15 = ppdVar5 + uVar30;
              uVar25 = 0;
              uVar29 = uVar30;
              do {
                lVar21 = ~uVar25 + uVar30;
                pdVar16 = ppdVar26[lVar21];
                pdVar4 = ppdVar5[lVar21];
                pdVar4[sVar12] = pdVar18[lVar21] / *pdVar16;
                if (1 < uVar19) {
                  lVar21 = 0;
                  do {
                    if (uVar30 <= uVar29 + lVar21) break;
                    pdVar4[sVar12] = pdVar4[sVar12] - pdVar16[lVar21 + 1] * ppdVar15[lVar21][sVar12]
                    ;
                    lVar21 = lVar21 + 1;
                  } while (uVar19 - 1 != lVar21);
                }
                uVar25 = uVar25 + 1;
                ppdVar15 = ppdVar15 + -1;
                uVar29 = uVar29 - 1;
              } while (uVar25 != uVar30);
            }
            if (pHVar11->gv_length != 0) {
              HTS_PStream_calc_gv(pHVar11,sVar12,&local_a0,&local_a8);
              dVar35 = pHVar11->gv_mean[sVar12] / local_a8;
              if (dVar35 < 0.0) {
                dVar35 = sqrt(dVar35);
              }
              else {
                dVar35 = SQRT(dVar35);
              }
              sVar13 = pHVar11->length;
              if (sVar13 != 0) {
                pHVar14 = pHVar11->gv_switch;
                sVar20 = 0;
                do {
                  if (pHVar14[sVar20] != '\0') {
                    pHVar11->par[sVar20][sVar12] =
                         (pHVar11->par[sVar20][sVar12] - local_a0) * dVar35 + local_a0;
                  }
                  sVar20 = sVar20 + 1;
                } while (sVar13 != sVar20);
              }
              HTS_PStream_calc_wuw_and_wum(pHVar11,sVar12);
              uVar30 = pHVar11->length;
              lVar21 = pHVar11->win_size * uVar30;
              auVar37._8_4_ = (int)((ulong)lVar21 >> 0x20);
              auVar37._0_8_ = lVar21;
              auVar37._12_4_ = 0x45300000;
              dVar45 = 1.0 / ((auVar37._8_8_ - 1.9342813113834067e+25) +
                             ((double)CONCAT44(0x43300000,(int)lVar21) - 4503599627370496.0));
              auVar38._8_4_ = (int)(uVar30 >> 0x20);
              auVar38._0_8_ = uVar30;
              auVar38._12_4_ = 0x45300000;
              dStack_40 = auVar38._8_8_ - 1.9342813113834067e+25;
              local_48 = dStack_40 + ((double)CONCAT44(0x43300000,(int)uVar30) - 4503599627370496.0)
              ;
              lVar32 = uVar30 * uVar30;
              auVar39._8_4_ = (int)((ulong)lVar32 >> 0x20);
              auVar39._0_8_ = lVar32;
              auVar39._12_4_ = 0x45300000;
              lVar21 = uVar30 - 1;
              auVar40._8_4_ = (int)((ulong)lVar21 >> 0x20);
              auVar40._0_8_ = lVar21;
              auVar40._12_4_ = 0x45300000;
              dStack_90 = auVar40._8_8_ - 1.9342813113834067e+25;
              local_98 = dStack_90 + ((double)CONCAT44(0x43300000,(int)lVar21) - 4503599627370496.0)
              ;
              uVar19 = 1;
              dVar36 = 0.0;
              uVar41 = 0;
              dVar35 = 0.1;
              uStack_70 = 0;
              do {
                local_78 = dVar35;
                local_68 = dVar36;
                uStack_60 = uVar41;
                HTS_PStream_calc_gv(pHVar11,sVar12,&local_a0,&local_a8);
                pdVar16 = pHVar11->gv_mean;
                pdVar18 = pHVar11->gv_vari;
                dVar35 = pdVar18[sVar12];
                dVar36 = pdVar16[sVar12];
                dVar42 = 0.0;
                if (uVar30 != 0) {
                  ppdVar15 = (pHVar11->sm).wuw;
                  uVar29 = pHVar11->width;
                  ppdVar5 = pHVar11->par;
                  pdVar4 = (pHVar11->sm).g;
                  uVar25 = 0;
                  ppdVar26 = ppdVar15;
                  ppdVar28 = ppdVar5;
                  do {
                    pdVar6 = ppdVar15[uVar25];
                    pdVar4[uVar25] = *pdVar6 * ppdVar5[uVar25][sVar12];
                    if (1 < uVar29) {
                      uVar31 = 1;
                      lVar21 = -1;
                      do {
                        if (uVar25 + uVar31 < uVar30) {
                          pdVar4[uVar25] =
                               pdVar6[uVar31] * ppdVar28[uVar31][sVar12] + pdVar4[uVar25];
                        }
                        if (uVar31 <= uVar25) {
                          pdVar4[uVar25] =
                               ppdVar26[lVar21][uVar31] * ppdVar28[lVar21][sVar12] + pdVar4[uVar25];
                        }
                        uVar31 = uVar31 + 1;
                        lVar21 = lVar21 + -1;
                      } while (uVar29 != uVar31);
                    }
                    uVar25 = uVar25 + 1;
                    ppdVar28 = ppdVar28 + 1;
                    ppdVar26 = ppdVar26 + 1;
                  } while (uVar25 != uVar30);
                  pdVar6 = (pHVar11->sm).wum;
                  pHVar14 = pHVar11->gv_switch;
                  dVar42 = 0.0;
                  uVar29 = 0;
                  do {
                    dVar1 = pdVar6[uVar29];
                    dVar2 = pdVar18[sVar12];
                    dVar44 = ppdVar5[uVar29][sVar12] - local_a0;
                    dVar43 = (dVar1 - pdVar4[uVar29]) * dVar45;
                    if (pHVar14[uVar29] != '\0') {
                      dVar43 = dVar43 + ((dVar35 * -2.0 * (local_a8 - dVar36)) / local_48) * dVar44;
                    }
                    dVar42 = dVar42 + (pdVar4[uVar29] * -0.5 + dVar1) *
                                      ppdVar5[uVar29][sVar12] * dVar45;
                    pdVar4[uVar29] =
                         (1.0 / (*ppdVar15[uVar29] * -dVar45 +
                                ((dVar2 + dVar2) * dVar44 * dVar44 +
                                dVar2 * local_98 * (local_a8 - pdVar16[sVar12])) *
                                (-2.0 / ((auVar39._8_8_ - 1.9342813113834067e+25) +
                                        ((double)CONCAT44(0x43300000,(int)lVar32) -
                                        4503599627370496.0))))) * dVar43;
                    uVar29 = uVar29 + 1;
                  } while (uVar30 != uVar29);
                }
                uVar41 = 0x8000000000000000;
                dVar36 = -((local_a8 - (dVar36 + dVar36)) * local_a8 * -0.5 * dVar35 + dVar42);
                dVar35 = local_78;
                if ((1 < uVar19) &&
                   (dVar35 = (double)(~-(ulong)(local_68 < dVar36) & (ulong)local_78 |
                                     (ulong)(local_78 * 0.5) & -(ulong)(local_68 < dVar36)),
                   dVar36 < local_68)) {
                  dVar35 = dVar35 * 1.2;
                }
                if (uVar30 != 0) {
                  pHVar14 = pHVar11->gv_switch;
                  uVar29 = 0;
                  do {
                    if (pHVar14[uVar29] != '\0') {
                      pHVar11->par[uVar29][sVar12] =
                           (pHVar11->sm).g[uVar29] * dVar35 + pHVar11->par[uVar29][sVar12];
                    }
                    uVar29 = uVar29 + 1;
                  } while (uVar30 != uVar29);
                }
                uVar19 = uVar19 + 1;
              } while (uVar19 != 6);
            }
            sVar12 = sVar12 + 1;
          } while (sVar12 < pHVar11->vector_length);
        }
        sVar10 = sVar10 + 1;
      } while (sVar10 < pss->nstream);
    }
    HVar7 = '\x01';
  }
  else {
    HVar7 = '\0';
    HTS_error(1,"HTS_PstreamSet_create: HTS_PStreamSet should be clear.\n");
  }
  return HVar7;
}

Assistant:

HTS_Boolean HTS_PStreamSet_create(HTS_PStreamSet * pss, HTS_SStreamSet * sss, double *msd_threshold, double *gv_weight)
{
   size_t i, j, k, l, m;
   int shift;
   size_t frame, msd_frame, state;

   HTS_PStream *pst;
   HTS_Boolean not_bound;

   if (pss->nstream != 0) {
      HTS_error(1, "HTS_PstreamSet_create: HTS_PStreamSet should be clear.\n");
      return FALSE;
   }

   /* initialize */
   pss->nstream = HTS_SStreamSet_get_nstream(sss);
   pss->pstream = (HTS_PStream *) HTS_calloc(pss->nstream, sizeof(HTS_PStream));
   pss->total_frame = HTS_SStreamSet_get_total_frame(sss);

   /* create */
   for (i = 0; i < pss->nstream; i++) {
      pst = &pss->pstream[i];
      if (HTS_SStreamSet_is_msd(sss, i) == TRUE) {      /* for MSD */
         pst->length = 0;
         for (state = 0; state < HTS_SStreamSet_get_total_state(sss); state++)
            if (HTS_SStreamSet_get_msd(sss, i, state) > msd_threshold[i])
               pst->length += HTS_SStreamSet_get_duration(sss, state);
         pst->msd_flag = (HTS_Boolean *) HTS_calloc(pss->total_frame, sizeof(HTS_Boolean));
         for (state = 0, frame = 0; state < HTS_SStreamSet_get_total_state(sss); state++) {
            if (HTS_SStreamSet_get_msd(sss, i, state) > msd_threshold[i]) {
               for (j = 0; j < HTS_SStreamSet_get_duration(sss, state); j++) {
                  pst->msd_flag[frame] = TRUE;
                  frame++;
               }
            } else {
               for (j = 0; j < HTS_SStreamSet_get_duration(sss, state); j++) {
                  pst->msd_flag[frame] = FALSE;
                  frame++;
               }
            }
         }
      } else {                  /* for non MSD */
         pst->length = pss->total_frame;
         pst->msd_flag = NULL;
      }
      pst->vector_length = HTS_SStreamSet_get_vector_length(sss, i);
      pst->width = HTS_SStreamSet_get_window_max_width(sss, i) * 2 + 1; /* band width of R */
      pst->win_size = HTS_SStreamSet_get_window_size(sss, i);
      if (pst->length > 0) {
         pst->sm.mean = HTS_alloc_matrix(pst->length, pst->vector_length * pst->win_size);
         pst->sm.ivar = HTS_alloc_matrix(pst->length, pst->vector_length * pst->win_size);
         pst->sm.wum = (double *) HTS_calloc(pst->length, sizeof(double));
         pst->sm.wuw = HTS_alloc_matrix(pst->length, pst->width);
         pst->sm.g = (double *) HTS_calloc(pst->length, sizeof(double));
         pst->par = HTS_alloc_matrix(pst->length, pst->vector_length);
      }
      /* copy dynamic window */
      pst->win_l_width = (int *) HTS_calloc(pst->win_size, sizeof(int));
      pst->win_r_width = (int *) HTS_calloc(pst->win_size, sizeof(int));
      pst->win_coefficient = (double **) HTS_calloc(pst->win_size, sizeof(double));
      for (j = 0; j < pst->win_size; j++) {
         pst->win_l_width[j] = HTS_SStreamSet_get_window_left_width(sss, i, j);
         pst->win_r_width[j] = HTS_SStreamSet_get_window_right_width(sss, i, j);
         if (pst->win_l_width[j] + pst->win_r_width[j] == 0)
            pst->win_coefficient[j] = (double *)
                HTS_calloc(-2 * pst->win_l_width[j] + 1, sizeof(double));
         else
            pst->win_coefficient[j] = (double *)
                HTS_calloc(-2 * pst->win_l_width[j], sizeof(double));
         pst->win_coefficient[j] -= pst->win_l_width[j];
         for (shift = pst->win_l_width[j]; shift <= pst->win_r_width[j]; shift++)
            pst->win_coefficient[j][shift] = HTS_SStreamSet_get_window_coefficient(sss, i, j, shift);
      }
      /* copy GV */
      if (HTS_SStreamSet_use_gv(sss, i)) {
         pst->gv_mean = (double *) HTS_calloc(pst->vector_length, sizeof(double));
         pst->gv_vari = (double *) HTS_calloc(pst->vector_length, sizeof(double));
         for (j = 0; j < pst->vector_length; j++) {
            pst->gv_mean[j] = HTS_SStreamSet_get_gv_mean(sss, i, j) * gv_weight[i];
            pst->gv_vari[j] = HTS_SStreamSet_get_gv_vari(sss, i, j);
         }
         pst->gv_switch = (HTS_Boolean *) HTS_calloc(pst->length, sizeof(HTS_Boolean));
         if (HTS_SStreamSet_is_msd(sss, i) == TRUE) {   /* for MSD */
            for (state = 0, frame = 0, msd_frame = 0; state < HTS_SStreamSet_get_total_state(sss); state++)
               for (j = 0; j < HTS_SStreamSet_get_duration(sss, state); j++, frame++)
                  if (pst->msd_flag[frame] == TRUE)
                     pst->gv_switch[msd_frame++] = HTS_SStreamSet_get_gv_switch(sss, i, state);
         } else {               /* for non MSD */
            for (state = 0, frame = 0; state < HTS_SStreamSet_get_total_state(sss); state++)
               for (j = 0; j < HTS_SStreamSet_get_duration(sss, state); j++)
                  pst->gv_switch[frame++] = HTS_SStreamSet_get_gv_switch(sss, i, state);
         }
         for (j = 0, pst->gv_length = 0; j < pst->length; j++)
            if (pst->gv_switch[j])
               pst->gv_length++;
      } else {
         pst->gv_switch = NULL;
         pst->gv_length = 0;
         pst->gv_mean = NULL;
         pst->gv_vari = NULL;
      }
      /* copy pdfs */
      if (HTS_SStreamSet_is_msd(sss, i) == TRUE) {      /* for MSD */
         for (state = 0, frame = 0, msd_frame = 0; state < HTS_SStreamSet_get_total_state(sss); state++) {
            for (j = 0; j < HTS_SStreamSet_get_duration(sss, state); j++) {
               if (pst->msd_flag[frame] == TRUE) {
                  /* check current frame is MSD boundary or not */
                  for (k = 0; k < pst->win_size; k++) {
                     not_bound = TRUE;
                     for (shift = pst->win_l_width[k]; shift <= pst->win_r_width[k]; shift++)
                        if ((int) frame + shift < 0 || (int) pss->total_frame <= (int) frame + shift || pst->msd_flag[frame + shift] != TRUE) {
                           not_bound = FALSE;
                           break;
                        }
                     for (l = 0; l < pst->vector_length; l++) {
                        m = pst->vector_length * k + l;
                        pst->sm.mean[msd_frame][m] = HTS_SStreamSet_get_mean(sss, i, state, m);
                        if (not_bound || k == 0)
                           pst->sm.ivar[msd_frame][m] = HTS_finv(HTS_SStreamSet_get_vari(sss, i, state, m));
                        else
                           pst->sm.ivar[msd_frame][m] = 0.0;
                     }
                  }
                  msd_frame++;
               }
               frame++;
            }
         }
      } else {                  /* for non MSD */
         for (state = 0, frame = 0; state < HTS_SStreamSet_get_total_state(sss); state++) {
            for (j = 0; j < HTS_SStreamSet_get_duration(sss, state); j++) {
               for (k = 0; k < pst->win_size; k++) {
                  not_bound = TRUE;
                  for (shift = pst->win_l_width[k]; shift <= pst->win_r_width[k]; shift++)
                     if ((int) frame + shift < 0 || (int) pss->total_frame <= (int) frame + shift) {
                        not_bound = FALSE;
                        break;
                     }
                  for (l = 0; l < pst->vector_length; l++) {
                     m = pst->vector_length * k + l;
                     pst->sm.mean[frame][m] = HTS_SStreamSet_get_mean(sss, i, state, m);
                     if (not_bound || k == 0)
                        pst->sm.ivar[frame][m] = HTS_finv(HTS_SStreamSet_get_vari(sss, i, state, m));
                     else
                        pst->sm.ivar[frame][m] = 0.0;
                  }
               }
               frame++;
            }
         }
      }
      /* parameter generation */
      HTS_PStream_mlpg(pst);
   }

   return TRUE;
}